

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  anon_union_80_1_493b367e_for_UninterpretedOption_3 aVar1;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
            (&(this->field_0)._impl_.name_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [80])aVar1 & (undefined1  [80])0x7) != (undefined1  [80])0x0) {
    if (((undefined1  [80])aVar1 & (undefined1  [80])0x1) != (undefined1  [80])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.identifier_value_);
    }
    if (((undefined1  [80])aVar1 & (undefined1  [80])0x2) != (undefined1  [80])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.string_value_);
    }
    if (((undefined1  [80])aVar1 & (undefined1  [80])0x4) != (undefined1  [80])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.aggregate_value_);
    }
  }
  if (((undefined1  [80])aVar1 & (undefined1  [80])0x38) != (undefined1  [80])0x0) {
    (this->field_0)._impl_.positive_int_value_ = 0;
    (this->field_0)._impl_.negative_int_value_ = 0;
    (this->field_0)._impl_.double_value_ = 0.0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void UninterpretedOption::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.name_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.identifier_value_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.string_value_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.aggregate_value_.ClearNonDefaultToEmpty();
    }
  }
  if ((cached_has_bits & 0x00000038u) != 0) {
    ::memset(&_impl_.positive_int_value_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.double_value_) -
        reinterpret_cast<char*>(&_impl_.positive_int_value_)) + sizeof(_impl_.double_value_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}